

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_deserializer.cpp
# Opt level: O2

string * __thiscall
duckdb::BinaryDeserializer::ReadString_abi_cxx11_
          (string *__return_storage_ptr__,BinaryDeserializer *this)

{
  uint uVar1;
  tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> tVar2;
  ulong uVar3;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false> buffer;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> local_28;
  
  uVar1 = VarIntDecode<unsigned_int>(this);
  if (uVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    uVar3 = (ulong)uVar1;
    tVar2.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
         operator_new__(uVar3);
    local_28._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
         tVar2.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (**this->stream->_vptr_ReadStream)
              (this->stream,
               tVar2.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,uVar3);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,
               tVar2.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
               uVar3 + (long)tVar2.
                             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                             .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    ::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

string BinaryDeserializer::ReadString() {
	auto len = VarIntDecode<uint32_t>();
	if (len == 0) {
		return string();
	}
	auto buffer = make_unsafe_uniq_array_uninitialized<data_t>(len);
	ReadData(buffer.get(), len);
	return string(const_char_ptr_cast(buffer.get()), len);
}